

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

void ImGui::TablePopBackgroundChannel(void)

{
  ImGuiWindow *window_00;
  ImGuiTable *pIVar1;
  ImGuiTableColumn *pIVar2;
  ImGuiTableColumn *column;
  ImGuiTable *table;
  ImGuiWindow *window;
  ImGuiContext *g;
  
  window_00 = GImGui->CurrentWindow;
  pIVar1 = GImGui->CurrentTable;
  pIVar2 = ImSpan<ImGuiTableColumn>::operator[](&pIVar1->Columns,pIVar1->CurrentColumn);
  SetWindowClipRectBeforeSetChannel(window_00,&pIVar1->HostBackupInnerClipRect);
  ImDrawListSplitter::SetCurrentChannel
            (&pIVar1->DrawSplitter,window_00->DrawList,(uint)pIVar2->DrawChannelCurrent);
  return;
}

Assistant:

void ImGui::TablePopBackgroundChannel()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    ImGuiTable* table = g.CurrentTable;
    ImGuiTableColumn* column = &table->Columns[table->CurrentColumn];

    // Optimization: avoid PopClipRect() + SetCurrentChannel()
    SetWindowClipRectBeforeSetChannel(window, table->HostBackupInnerClipRect);
    table->DrawSplitter.SetCurrentChannel(window->DrawList, column->DrawChannelCurrent);
}